

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLABecLaplacian::setBCoeffs
          (MLABecLaplacian *this,int amrlev,Array<const_MultiFab_*,_3> *beta)

{
  int iVar1;
  int idim;
  long lVar2;
  int iVar3;
  
  iVar1 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  iVar3 = (beta->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  if (iVar3 != iVar1 && iVar3 != 1) {
    Assert_host("beta[0]->nComp() == 1 || beta[0]->nComp() == ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLABecLaplacian.cpp"
                ,0xa2,(char *)0x0);
    iVar3 = (beta->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  }
  lVar2 = 0;
  if (iVar3 == iVar1) {
    do {
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          MultiFab::Copy((MultiFab *)
                         (*(long *)&(this->m_b_coeffs).
                                    super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                    .
                                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         + lVar2 * 0x180),beta->_M_elems[lVar2],iVar3,iVar3,1,0);
          iVar3 = iVar3 + 1;
        } while (iVar1 != iVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
    do {
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          MultiFab::Copy((MultiFab *)
                         (*(long *)&(this->m_b_coeffs).
                                    super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                    .
                                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         + lVar2 * 0x180),beta->_M_elems[lVar2],0,iVar3,1,0);
          iVar3 = iVar3 + 1;
        } while (iVar1 != iVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  this->m_needs_update = true;
  return;
}

Assistant:

void
MLABecLaplacian::setBCoeffs (int amrlev,
                             const Array<MultiFab const*,AMREX_SPACEDIM>& beta)
{
    const int ncomp = getNComp();
    AMREX_ALWAYS_ASSERT(beta[0]->nComp() == 1 || beta[0]->nComp() == ncomp);
    if (beta[0]->nComp() == ncomp)
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                MultiFab::Copy(m_b_coeffs[amrlev][0][idim], *beta[idim], icomp, icomp, 1, 0);
            }
        }
    else
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                MultiFab::Copy(m_b_coeffs[amrlev][0][idim], *beta[idim], 0, icomp, 1, 0);
            }
        }
    m_needs_update = true;
}